

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::ZeroObjColSingletonPS::execute
          (ZeroObjColSingletonPS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  VarStatus *pVVar4;
  undefined8 uVar5;
  VarStatus VVar6;
  long *in_RDI;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_R9;
  double dVar7;
  VectorBase<double> *this_00;
  double dVar8;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_00000008;
  byte in_stack_00000010;
  double up;
  double lo;
  double z2;
  double z1;
  double scale2;
  double scale1;
  double aij;
  string *in_stack_fffffffffffffce8;
  int iVar9;
  SPxException *in_stack_fffffffffffffcf0;
  SVectorBase<double> *in_stack_fffffffffffffcf8;
  Real in_stack_fffffffffffffd00;
  double local_1c0;
  double local_1b8;
  allocator local_141;
  string local_140 [38];
  undefined1 local_11a;
  allocator local_119;
  string local_118 [38];
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [38];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  Real local_88;
  double local_80;
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  double local_40;
  byte local_31;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *local_30;
  
  local_31 = in_stack_00000010 & 1;
  local_30 = in_R9;
  if ((int)in_RDI[5] != (int)in_RDI[6]) {
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffcf0,
                        (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
    dVar7 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffcf0,
                        (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
    *pdVar3 = dVar7;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffcf0,
                        (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
    dVar7 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffcf0,
                        (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
    *pdVar3 = dVar7;
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (local_30,(int)in_RDI[5]);
    VVar6 = *pVVar4;
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (local_30,(int)in_RDI[6]);
    *pVVar4 = VVar6;
  }
  local_40 = SVectorBase<double>::operator[]
                       (in_stack_fffffffffffffcf8,(int)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
  VectorBase<double>::operator[]
            ((VectorBase<double> *)in_stack_fffffffffffffcf0,
             (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  bVar2 = isZero<double,double>((double)in_stack_fffffffffffffcf0,(double)in_stack_fffffffffffffce8)
  ;
  iVar9 = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  if (bVar2) {
    pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffcf0,iVar9);
    *pdVar3 = 0.0;
  }
  else {
    pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffcf0,iVar9);
    dVar7 = *pdVar3;
    pdVar3 = (double *)infinity();
    if (*pdVar3 <= dVar7) {
      local_75 = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_60,"Simplifier: infinite activities - aborting unsimplification",&local_61);
      SPxException::SPxException(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      local_75 = 0;
      __cxa_throw(uVar5,&SPxException::typeinfo,SPxException::~SPxException);
    }
  }
  VectorBase<double>::operator[]
            ((VectorBase<double> *)in_stack_fffffffffffffcf0,
             (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  local_80 = maxAbs(in_stack_fffffffffffffd00,(Real)in_stack_fffffffffffffcf8);
  VectorBase<double>::operator[]
            ((VectorBase<double> *)in_stack_fffffffffffffcf0,
             (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  local_88 = maxAbs(in_stack_fffffffffffffd00,(Real)in_stack_fffffffffffffcf8);
  if (local_80 < 1.0) {
    local_80 = 1.0;
  }
  if (local_88 < 1.0) {
    local_88 = 1.0;
  }
  dVar7 = (double)in_RDI[7] / local_80;
  pdVar3 = VectorBase<double>::operator[]
                     ((VectorBase<double> *)in_stack_fffffffffffffcf0,
                      (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  local_90 = dVar7 - *pdVar3 / local_80;
  dVar7 = (double)in_RDI[8] / local_88;
  pdVar3 = VectorBase<double>::operator[]
                     ((VectorBase<double> *)in_stack_fffffffffffffcf0,
                      (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  local_98 = dVar7 - *pdVar3 / local_88;
  (**(code **)(*in_RDI + 0x38))();
  bVar2 = isZero<double,double>((double)in_stack_fffffffffffffcf0,(double)in_stack_fffffffffffffce8)
  ;
  if (bVar2) {
    local_90 = 0.0;
  }
  (**(code **)(*in_RDI + 0x38))();
  bVar2 = isZero<double,double>((double)in_stack_fffffffffffffcf0,(double)in_stack_fffffffffffffce8)
  ;
  if (bVar2) {
    local_98 = 0.0;
  }
  if (local_40 <= 0.0) {
    local_1b8 = local_98 * local_88;
  }
  else {
    local_1b8 = local_90 * local_80;
  }
  local_1b8 = local_1b8 / local_40;
  local_a0 = local_1b8;
  if (local_40 <= 0.0) {
    local_1c0 = local_90 * local_80;
  }
  else {
    local_1c0 = local_98 * local_88;
  }
  local_1c0 = local_1c0 / local_40;
  local_a8 = local_1c0;
  (**(code **)(*in_RDI + 0x30))();
  bVar2 = isZero<double,double>((double)in_stack_fffffffffffffcf0,(double)in_stack_fffffffffffffce8)
  ;
  if (bVar2) {
    local_a0 = 0.0;
  }
  (**(code **)(*in_RDI + 0x30))();
  bVar2 = isZero<double,double>((double)in_stack_fffffffffffffcf0,(double)in_stack_fffffffffffffce8)
  ;
  if (bVar2) {
    local_a8 = 0.0;
  }
  pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                     (in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
  if (*pVVar4 == ON_LOWER) {
    dVar7 = (double)in_RDI[9];
    pdVar3 = (double *)infinity();
    if ((-*pdVar3 < dVar7) ||
       (dVar7 = (double)in_RDI[10], pdVar3 = (double *)infinity(), dVar7 < *pdVar3)) {
      iVar9 = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
      if (((double)in_RDI[9] != (double)in_RDI[10]) ||
         (NAN((double)in_RDI[9]) || NAN((double)in_RDI[10]))) {
        if (local_40 <= 0.0) {
          if (0.0 <= local_40) {
            local_ca = 1;
            uVar5 = __cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_c8,"XMAISM01 This should never happen.",&local_c9);
            SPxInternalCodeException::SPxInternalCodeException
                      ((SPxInternalCodeException *)in_stack_fffffffffffffcf0,
                       in_stack_fffffffffffffce8);
            local_ca = 0;
            __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                        SPxInternalCodeException::~SPxInternalCodeException);
          }
          dVar7 = (double)in_RDI[9];
          pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffcf0,iVar9);
          *pdVar3 = dVar7;
          pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (local_30,(int)in_RDI[5]);
          *pVVar4 = ON_LOWER;
        }
        else {
          dVar7 = (double)in_RDI[10];
          pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffcf0,iVar9);
          *pdVar3 = dVar7;
          pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (local_30,(int)in_RDI[5]);
          *pVVar4 = ON_UPPER;
        }
      }
      else {
        dVar7 = (double)in_RDI[9];
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcf0,iVar9);
        *pdVar3 = dVar7;
        pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (local_30,(int)in_RDI[5]);
        *pVVar4 = FIXED;
      }
    }
    else {
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcf0,
                          (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
      *pdVar3 = 0.0;
      pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (local_30,(int)in_RDI[5]);
      *pVVar4 = ZERO;
    }
  }
  else {
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
    if (*pVVar4 == ON_UPPER) {
      dVar7 = (double)in_RDI[9];
      pdVar3 = (double *)infinity();
      if ((-*pdVar3 < dVar7) ||
         (dVar7 = (double)in_RDI[10], pdVar3 = (double *)infinity(), dVar7 < *pdVar3)) {
        iVar9 = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
        if (((double)in_RDI[9] != (double)in_RDI[10]) ||
           (NAN((double)in_RDI[9]) || NAN((double)in_RDI[10]))) {
          if (local_40 <= 0.0) {
            if (0.0 <= local_40) {
              local_f2 = 1;
              uVar5 = __cxa_allocate_exception(0x28);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_f0,"XMAISM02 This should never happen.",&local_f1);
              SPxInternalCodeException::SPxInternalCodeException
                        ((SPxInternalCodeException *)in_stack_fffffffffffffcf0,
                         in_stack_fffffffffffffce8);
              local_f2 = 0;
              __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                          SPxInternalCodeException::~SPxInternalCodeException);
            }
            dVar7 = (double)in_RDI[10];
            pdVar3 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffcf0,iVar9);
            *pdVar3 = dVar7;
            pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                               (local_30,(int)in_RDI[5]);
            *pVVar4 = ON_UPPER;
          }
          else {
            dVar7 = (double)in_RDI[9];
            pdVar3 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffcf0,iVar9);
            *pdVar3 = dVar7;
            pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                               (local_30,(int)in_RDI[5]);
            *pVVar4 = ON_LOWER;
          }
        }
        else {
          dVar7 = (double)in_RDI[9];
          pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffcf0,iVar9);
          *pdVar3 = dVar7;
          pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (local_30,(int)in_RDI[5]);
          *pVVar4 = FIXED;
        }
      }
      else {
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcf0,
                            (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
        *pdVar3 = 0.0;
        pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (local_30,(int)in_RDI[5]);
        *pVVar4 = ZERO;
      }
    }
    else {
      pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
      if (*pVVar4 == FIXED) {
        dVar7 = (double)in_RDI[9];
        pdVar3 = (double *)infinity();
        iVar9 = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
        if ((-*pdVar3 < dVar7) ||
           (dVar7 = (double)in_RDI[10], pdVar3 = (double *)infinity(), dVar7 < *pdVar3)) {
          dVar7 = (double)in_RDI[9];
          dVar8 = (double)in_RDI[10];
          pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffcf0,iVar9);
          *pdVar3 = (dVar7 + dVar8) / 2.0;
          pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (local_30,(int)in_RDI[5]);
          *pVVar4 = FIXED;
        }
        else {
          pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffcf0,iVar9);
          *pdVar3 = 0.0;
          pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (local_30,(int)in_RDI[5]);
          *pVVar4 = ZERO;
        }
      }
      else {
        pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
        if (*pVVar4 != BASIC) {
          uVar5 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_140,"XMAISM04 This should never happen.",&local_141);
          SPxInternalCodeException::SPxInternalCodeException
                    ((SPxInternalCodeException *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8
                    );
          __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                      SPxInternalCodeException::~SPxInternalCodeException);
        }
        (**(code **)(*in_RDI + 0x30))();
        bVar2 = GErel<double,double,double>
                          ((double)in_stack_fffffffffffffcf0,(double)in_stack_fffffffffffffce8,
                           1.32443584801888e-317);
        if ((!bVar2) ||
           (dVar7 = (double)in_RDI[9], pdVar3 = (double *)infinity(), dVar7 <= -*pdVar3)) {
          (**(code **)(*in_RDI + 0x30))();
          bVar2 = LErel<double,double,double>
                            ((double)in_stack_fffffffffffffcf0,(double)in_stack_fffffffffffffce8,
                             1.32457962112182e-317);
          if ((!bVar2) ||
             (dVar7 = (double)in_RDI[10], pdVar3 = (double *)infinity(), *pdVar3 <= dVar7)) {
            dVar8 = local_a0;
            pdVar3 = (double *)infinity();
            dVar1 = local_a0;
            dVar7 = local_a8;
            if (dVar8 <= -*pdVar3) {
              pdVar3 = (double *)infinity();
              dVar8 = local_a8;
              if (*pdVar3 <= dVar7) {
                local_11a = 1;
                uVar5 = __cxa_allocate_exception(0x28);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_118,"XMAISM03 This should never happen.",&local_119);
                SPxInternalCodeException::SPxInternalCodeException
                          ((SPxInternalCodeException *)in_stack_fffffffffffffcf0,
                           in_stack_fffffffffffffce8);
                local_11a = 0;
                __cxa_throw(uVar5,&SPxInternalCodeException::typeinfo,
                            SPxInternalCodeException::~SPxInternalCodeException);
              }
              pdVar3 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffcf0,
                                  (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
              *pdVar3 = dVar8;
              pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (local_30,(int)in_RDI[5]);
              *pVVar4 = BASIC;
              bVar2 = local_40 <= 0.0;
              pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
              *pVVar4 = (uint)bVar2;
            }
            else {
              pdVar3 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffcf0,
                                  (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
              *pdVar3 = dVar1;
              pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (local_30,(int)in_RDI[5]);
              *pVVar4 = BASIC;
              bVar2 = 0.0 < local_40;
              pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
              *pVVar4 = (uint)bVar2;
            }
          }
          else {
            dVar7 = (double)in_RDI[10];
            pdVar3 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffcf0,
                                (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
            *pdVar3 = dVar7;
            VVar6 = ON_UPPER;
            if ((double)in_RDI[9] == (double)in_RDI[10]) {
              VVar6 = FIXED;
            }
            pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                               (local_30,(int)in_RDI[5]);
            *pVVar4 = VVar6;
          }
        }
        else {
          dVar7 = (double)in_RDI[9];
          pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffcf0,
                              (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
          *pdVar3 = dVar7;
          VVar6 = ON_LOWER;
          if ((double)in_RDI[9] == (double)in_RDI[10]) {
            VVar6 = FIXED;
          }
          pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (local_30,(int)in_RDI[5]);
          *pVVar4 = VVar6;
        }
      }
    }
  }
  dVar7 = local_40;
  pdVar3 = VectorBase<double>::operator[]
                     ((VectorBase<double> *)in_stack_fffffffffffffcf0,(int)((ulong)local_40 >> 0x20)
                     );
  this_00 = (VectorBase<double> *)(dVar7 * *pdVar3);
  pdVar3 = VectorBase<double>::operator[](this_00,(int)((ulong)dVar7 >> 0x20));
  *pdVar3 = (double)this_00 + *pdVar3;
  dVar8 = local_40 * -1.0;
  iVar9 = (int)((ulong)dVar7 >> 0x20);
  pdVar3 = VectorBase<double>::operator[](this_00,iVar9);
  dVar8 = dVar8 * *pdVar3;
  pdVar3 = VectorBase<double>::operator[](this_00,iVar9);
  *pdVar3 = dVar8;
  return;
}

Assistant:

void SPxMainSM<R>::ZeroObjColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal & basis:
   R aij = m_row[m_j];

   if(isZero(s[m_i], R(1e-6)))
      s[m_i] = 0.0;
   else if(s[m_i] >= R(infinity))
      // this is a fix for a highly ill conditioned instance that is "solved" in presolving (ilaser0 from MINLP, mittelmann)
      throw SPxException("Simplifier: infinite activities - aborting unsimplification");

   R scale1 = maxAbs(m_lhs, s[m_i]);
   R scale2 = maxAbs(m_rhs, s[m_i]);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (m_lhs / scale1) - (s[m_i] / scale1);
   R z2 = (m_rhs / scale2) - (s[m_i] / scale2);

   if(isZero(z1, this->epsilon()))
      z1 = 0.0;

   if(isZero(z2, this->epsilon()))
      z2 = 0.0;

   R lo = (aij > 0) ? z1 * scale1 / aij : z2 * scale2 / aij;
   R up = (aij > 0) ? z2 * scale2 / aij : z1 * scale1 / aij;

   if(isZero(lo, this->feastol()))
      lo = 0.0;

   if(isZero(up, this->feastol()))
      up = 0.0;

   assert(LErel(lo, up, this->epsilon()));
   SOPLEX_ASSERT_WARN("WMAISM01", isNotZero(aij, R(1.0 / R(infinity))));

   if(rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else
         throw SPxInternalCodeException("XMAISM01 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else
         throw SPxInternalCodeException("XMAISM02 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::FIXED)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else
      {
         assert(EQrel(m_lower, m_upper, this->feastol()));

         x[m_j]        = (m_lower + m_upper) / 2.0;
         cStatus[m_j]  = SPxSolverBase<R>::FIXED;
      }
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::BASIC)
   {
      if(GErel(m_lower, lo, this->feastol()) && m_lower > R(-infinity))
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else if(LErel(m_upper, up, this->feastol()) && m_upper < R(infinity))
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else if(lo > R(-infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = lo;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER);
      }
      else if(up < R(infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = up;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_UPPER : SPxSolverBase<R>::ON_LOWER);
      }
      else
         throw SPxInternalCodeException("XMAISM03 This should never happen.");
   }
   else
      throw SPxInternalCodeException("XMAISM04 This should never happen.");

   s[m_i] += aij * x[m_j];

   // dual:
   r[m_j] = -1.0 * aij * y[m_i];

   assert(!isOptimal || (cStatus[m_j] != SPxSolverBase<R>::BASIC || isZero(r[m_j], this->feastol())));

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM21 Dimension doesn't match after this step.");
   }

#endif
}